

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O1

XMLCh * __thiscall
xercesc_4_0::DatatypeValidator::getCanonicalRepresentation
          (DatatypeValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  short *psVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLCh *pXVar3;
  undefined7 in_register_00000009;
  size_t __n;
  
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = this->fMemoryManager;
  }
  if ((int)CONCAT71(in_register_00000009,toValidate) != 0) {
    (*(this->super_XSerializable)._vptr_XSerializable[8])(this,rawData,0,memMgr);
  }
  if (rawData != (XMLCh *)0x0) {
    __n = 0;
    do {
      psVar1 = (short *)((long)rawData + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar2 = (*memMgr->_vptr_MemoryManager[3])(memMgr,__n);
    pXVar3 = (XMLCh *)memcpy((void *)CONCAT44(extraout_var,iVar2),rawData,__n);
    return pXVar3;
  }
  return (XMLCh *)0x0;
}

Assistant:

const XMLCh* DatatypeValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                          ,      MemoryManager* const memMgr
                                                          ,      bool                 toValidate) const
{
    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;

    if (toValidate)
    {
        DatatypeValidator *temp = (DatatypeValidator*) this;

        try
        {
            temp->validate(rawData, 0, toUse);    
        }
        catch (...)
        {
            return 0;
        }
    }

    return XMLString::replicate(rawData, toUse);
}